

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O1

bool __thiscall
GF2::MI<8UL,_GF2::MOGrevlex<8UL>_>::Find
          (MI<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight,
          iterator *pos)

{
  int iVar1;
  _List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> _Var2;
  bool bVar3;
  
  _Var2 = std::
          __lower_bound<std::_List_iterator<GF2::MP<8ul,GF2::MOGrevlex<8ul>>>,GF2::MP<8ul,GF2::MOGrevlex<8ul>>,__gnu_cxx::__ops::_Iter_less_val>
                    ((this->
                     super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                     ).
                     super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next,this,polyRight);
  pos->_M_node = _Var2._M_node;
  if ((_Var2._M_node == (_List_node_base *)this) ||
     (_Var2._M_node[2]._M_next !=
      (_List_node_base *)
      (polyRight->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
      super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node._M_size)) {
    bVar3 = false;
  }
  else {
    iVar1 = MP<8UL,_GF2::MOGrevlex<8UL>_>::Compare
                      ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)(_Var2._M_node + 1),polyRight);
    bVar3 = iVar1 == 0;
  }
  return bVar3;
}

Assistant:

bool Find(const MP<_n, _O>& polyRight, iterator& pos)
	{
		if (IsConsistent(polyRight))
		{
			pos = std::lower_bound(begin(), end(), polyRight);
			return pos != end() && *pos == polyRight;
		}
		// сравнение несогласованных многочленов неэффективно,
		// поэтому сразу меняем порядок
		MP<_n, _O> poly(_order);
		pos = std::lower_bound(begin(), end(), poly = polyRight);
		return pos != end() && *pos == poly;
	}